

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::configCommandBuffer
          (TimestampTestInstance *this)

{
  VkCommandBuffer_s *pVVar1;
  VkResult VVar2;
  DeviceInterface *pDVar3;
  pointer pVVar4;
  uint uVar5;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  VVar2 = (*pDVar3->_vptr_DeviceInterface[0x49])
                    (pDVar3,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object
                    );
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x2ec);
  (*pDVar3->_vptr_DeviceInterface[0x70])
            (pDVar3,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.
             m_internal,0,8);
  uVar5 = 0;
  for (pVVar4 = (this->m_stages).
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar1 = (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
      pVVar4 != (this->m_stages).
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar4 = pVVar4 + 1) {
    (*pDVar3->_vptr_DeviceInterface[0x71])
              (pDVar3,pVVar1,(ulong)*pVVar4,
               (this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.
               m_internal,(ulong)uVar5);
    uVar5 = uVar5 + 1;
  }
  VVar2 = (*pDVar3->_vptr_DeviceInterface[0x4a])(pDVar3,pVVar1);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x2f6);
  return;
}

Assistant:

void TimestampTestInstance::configCommandBuffer(void)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,    // VkStructureType                  sType;
		DE_NULL,                                        // const void*                      pNext;
		0u,                                             // VkCommandBufferUsageFlags        flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));

	vk.cmdResetQueryPool(*m_cmdBuffer, *m_queryPool, 0u, TimestampTest::ENTRY_COUNT);

	deUint32 timestampEntry = 0;
	for (StageFlagVector::const_iterator it = m_stages.begin(); it != m_stages.end(); it++)
	{
		vk.cmdWriteTimestamp(*m_cmdBuffer, *it, *m_queryPool, timestampEntry++);
	}

	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
}